

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_append_entries_resp(raft_server *this,resp_msg *resp)

{
  int32_t my_id;
  raft_server *prVar1;
  ulong uVar2;
  bool bVar3;
  int32 iVar4;
  int iVar5;
  uint uVar6;
  int32 iVar7;
  __int_type_conflict _Var8;
  srv_role sVar9;
  uint uVar10;
  undefined4 extraout_var;
  element_type *peVar11;
  ulong uVar12;
  element_type *peVar13;
  char *pcVar14;
  ulong uVar15;
  element_type *peVar16;
  undefined4 extraout_var_00;
  atomic<int> *paVar17;
  uint64_t uVar18;
  custom_notification_msg *this_00;
  undefined4 extraout_var_02;
  element_type *this_01;
  element_type *peVar19;
  resp_msg *in_RSI;
  raft_server *in_RDI;
  ptr<peer> *in_stack_00000080;
  raft_server *in_stack_00000088;
  ptr<log_entry> custom_noti_le;
  ptr<custom_notification_msg> custom_noti;
  ptr<req_msg> req;
  ulong p_matched_idx;
  int log_lv;
  bool suppress;
  int log_lv_1;
  ptr<resp_appendix> appendix;
  bool do_log_rewind;
  ulong prev_next_log;
  lock_guard<std::mutex> guard;
  ulong committed_index;
  CbReturnCode rc;
  Param param;
  lock_guard<std::mutex> l;
  uint64_t new_matched_idx;
  uint64_t prev_matched_idx;
  int64 bs_hint;
  ptr<peer> p;
  bool need_to_catchup;
  peer_itor it;
  memory_order __b_1;
  memory_order __b;
  resp_msg *in_stack_fffffffffffffab8;
  undefined1 __i;
  shared_ptr<nuraft::peer> *args;
  peer *in_stack_fffffffffffffac0;
  shared_ptr<nuraft::buffer> *args_1;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  timer_helper *in_stack_fffffffffffffad0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  unsigned_long *in_stack_fffffffffffffae8;
  raft_server *in_stack_fffffffffffffb00;
  timer_helper *in_stack_fffffffffffffb08;
  atomic<unsigned_long> *args_6;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  raft_server *in_stack_fffffffffffffb30;
  raft_server *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  element_type *in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  uint in_stack_fffffffffffffbdc;
  bool local_3c2;
  rpc_handler *in_stack_fffffffffffffc68;
  ptr<req_msg> *in_stack_fffffffffffffc70;
  element_type *in_stack_fffffffffffffc78;
  peer *in_stack_fffffffffffffc80;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *target_idx;
  string local_2f0 [36];
  undefined4 local_2cc;
  undefined1 local_2b1;
  undefined4 local_29c;
  undefined4 local_284;
  raft_server *in_stack_fffffffffffffd80;
  undefined1 local_270 [16];
  ulong local_260;
  int32 local_258;
  undefined4 local_254;
  ulong local_250;
  string local_230 [32];
  raft_server *local_210;
  string local_208 [32];
  uint local_1e8;
  byte local_1e1;
  string local_1e0 [36];
  uint local_1bc;
  __shared_ptr local_198 [23];
  byte local_181;
  ulong local_180;
  ulong local_170;
  ReturnCode local_164;
  Param local_160;
  string local_148 [40];
  undefined1 *local_120;
  ptr<req_msg> *local_118;
  string local_110 [32];
  int64 local_f0;
  string local_e8 [55];
  bool local_b1;
  string local_b0 [48];
  string local_80 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_60;
  int32 local_54;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_50;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_48;
  resp_msg *local_40;
  element_type *local_30;
  memory_order local_28;
  int local_24;
  atomic<unsigned_long> *local_20;
  uint local_14;
  memory_order local_10;
  int local_c;
  atomic<int> *local_8;
  undefined4 extraout_var_01;
  
  target_idx = &in_RDI->peers_;
  local_40 = in_RSI;
  local_54 = msg_base::get_src(&in_RSI->super_msg_base);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               *)in_stack_fffffffffffffab8,(key_type *)0x1bbb5e);
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)in_stack_fffffffffffffac0,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             in_stack_fffffffffffffab8);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
              *)in_stack_fffffffffffffab8);
  bVar3 = std::__detail::operator==(&local_48,&local_60);
  if (bVar3) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
    if (!bVar3) {
      return;
    }
    peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bbbe6);
    iVar5 = (*peVar19->_vptr_logger[7])();
    if (iVar5 < 4) {
      return;
    }
    peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bbc0c);
    uVar10 = msg_base::get_src(&local_40->super_msg_base);
    msg_if_given_abi_cxx11_
              ((char *)local_80,"the response is from an unknown peer %d",(ulong)uVar10);
    (*peVar19->_vptr_logger[8])
              (peVar19,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"handle_append_entries_resp",0x3bd,local_80);
    std::__cxx11::string::~string(local_80);
    return;
  }
  check_srv_to_leave_timeout(in_stack_fffffffffffffb30);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->srv_to_leave_);
  if (bVar3) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bbced);
    iVar7 = peer::get_id((peer *)0x1bbcf5);
    iVar4 = msg_base::get_src(&local_40->super_msg_base);
    if (iVar7 == iVar4) {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1bbd2e);
      bVar3 = peer::is_stepping_down((peer *)0x1bbd36);
      if ((bVar3) &&
         (uVar12 = resp_msg::get_next_idx(local_40), in_RDI->srv_to_leave_target_idx_ < uVar12)) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
        if (bVar3) {
          peVar19 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bbd92);
          iVar5 = (*peVar19->_vptr_logger[7])();
          if (3 < iVar5) {
            peVar19 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1bbdb8);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1bbdd4);
            uVar10 = peer::get_id((peer *)0x1bbddc);
            msg_if_given_abi_cxx11_
                      ((char *)local_b0,
                       "server to be removed %d fully caught up the target config log %lu",
                       (ulong)uVar10,in_RDI->srv_to_leave_target_idx_);
            (*peVar19->_vptr_logger[8])
                      (peVar19,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"handle_append_entries_resp",0x3ca,local_b0);
            std::__cxx11::string::~string(local_b0);
          }
        }
        remove_peer_from_peers
                  ((raft_server *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                   (ptr<peer> *)in_stack_fffffffffffffb08);
        reset_srv_to_leave(in_stack_fffffffffffffb00);
        return;
      }
    }
  }
  local_b1 = true;
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)0x1bbeb2);
  std::shared_ptr<nuraft::peer>::shared_ptr
            ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffac0,
             (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffab8);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar3) {
    peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bbef7);
    iVar5 = (*peVar19->_vptr_logger[7])();
    if (5 < iVar5) {
      peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bbf30);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1bbf45);
      uVar10 = peer::get_id((peer *)0x1bbf4d);
      uVar12 = resp_msg::get_next_idx(local_40);
      msg_if_given_abi_cxx11_
                ((char *)local_e8,"handle append entries resp (from %d), resp.get_next_idx(): %lu",
                 (ulong)uVar10,uVar12);
      (*peVar19->_vptr_logger[8])
                (peVar19,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3d6,local_e8);
      std::__cxx11::string::~string(local_e8);
    }
  }
  local_f0 = resp_msg::get_next_batch_size_hint_in_bytes(local_40);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar3) {
    peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bc06e);
    iVar5 = (*peVar19->_vptr_logger[7])();
    if (5 < iVar5) {
      peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bc0a7);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1bc0bc);
      uVar10 = peer::get_id((peer *)0x1bc0c4);
      msg_if_given_abi_cxx11_
                ((char *)local_110,"peer %d batch size hint: %ld bytes",(ulong)uVar10,local_f0);
      (*peVar19->_vptr_logger[8])
                (peVar19,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"handle_append_entries_resp",0x3d9,local_110);
      std::__cxx11::string::~string(local_110);
    }
  }
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1bc16a
            );
  peer::set_next_batch_size_hint_in_bytes
            (in_stack_fffffffffffffac0,(int64)in_stack_fffffffffffffab8);
  bVar3 = resp_msg::get_accepted(local_40);
  if (bVar3) {
    local_118 = (ptr<req_msg> *)0x0;
    local_120 = (undefined1 *)0x0;
    peVar11 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bc1c7);
    peer::get_lock(peVar11);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffac0,
               (mutex_type *)in_stack_fffffffffffffab8);
    in_stack_fffffffffffffc78 =
         std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x1bc1fd);
    in_stack_fffffffffffffc80 = (peer *)resp_msg::get_next_idx(local_40);
    peer::set_next_log_idx(in_stack_fffffffffffffac0,(ulong)in_stack_fffffffffffffab8);
    peVar11 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bc240);
    in_stack_fffffffffffffc70 = (ptr<req_msg> *)peer::get_matched_idx(peVar11);
    local_118 = in_stack_fffffffffffffc70;
    in_stack_fffffffffffffc68 = (rpc_handler *)resp_msg::get_next_idx(local_40);
    local_120 = (undefined1 *)((long)&in_stack_fffffffffffffc68[-1]._M_invoker + 7);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
    if (bVar3) {
      peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bc2be);
      iVar5 = (*peVar19->_vptr_logger[7])();
      if (5 < iVar5) {
        peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bc2f7);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1bc30c);
        uVar10 = peer::get_id((peer *)0x1bc314);
        msg_if_given_abi_cxx11_
                  ((char *)local_148,"peer %d, prev matched idx: %lu, new matched idx: %lu",
                   (ulong)uVar10,local_118,local_120);
        (*peVar19->_vptr_logger[8])
                  (peVar19,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"handle_append_entries_resp",0x3e5,local_148);
        std::__cxx11::string::~string(local_148);
      }
    }
    peVar11 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bc3db);
    peer::set_matched_idx(peVar11,(ulong)local_120);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bc3fa);
    peer::set_last_accepted_log_idx(in_stack_fffffffffffffac0,(uint64_t)in_stack_fffffffffffffab8);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1bc419);
    my_id = in_RDI->id_;
    _Var8 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bc448);
    iVar7 = peer::get_id((peer *)0x1bc450);
    cb_func::Param::Param(&local_160,my_id,_Var8,iVar7,(void *)0x0);
    local_160.ctx = &local_120;
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1bc4a6);
    local_164 = cb_func::call((cb_func *)
                              CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                              (Type)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                              (Param *)in_stack_fffffffffffffab8);
    local_170 = get_expected_committed_log_idx(in_stack_fffffffffffffd80);
    commit(in_RDI,(ulong)target_idx);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bc521);
    bVar3 = peer::clear_pending_commit(in_stack_fffffffffffffac0);
    local_3c2 = true;
    if (!bVar3) {
      uVar12 = resp_msg::get_next_idx(local_40);
      peVar16 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bc574);
      iVar5 = (*peVar16->_vptr_log_store[2])();
      local_3c2 = uVar12 < CONCAT44(extraout_var,iVar5);
    }
    local_b1 = local_3c2;
  }
  else {
    peVar11 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bc5db);
    peer::get_lock(peVar11);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffac0,
               (mutex_type *)in_stack_fffffffffffffab8);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bc611);
    local_180 = peer::get_next_log_idx((peer *)0x1bc619);
    uVar12 = resp_msg::get_next_idx(local_40);
    uVar2 = local_180;
    if ((uVar12 == 0) || (uVar12 = resp_msg::get_next_idx(local_40), uVar2 <= uVar12)) {
      local_181 = 1;
      resp_msg::get_ctx(in_stack_fffffffffffffab8);
      bVar3 = std::__shared_ptr::operator_cast_to_bool(local_198);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1bc739);
      if (bVar3) {
        resp_msg::get_ctx(in_stack_fffffffffffffab8);
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  in_stack_fffffffffffffac0);
        resp_appendix::deserialize((buffer *)in_stack_fffffffffffffb08);
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1bc78c);
        peVar13 = std::
                  __shared_ptr_access<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bc799);
        if (peVar13->extra_order_ == DO_NOT_REWIND) {
          local_181 = 0;
        }
        if ((handle_append_entries_resp(nuraft::resp_msg&)::extra_order_timer == '\0') &&
           (iVar5 = __cxa_guard_acquire(&handle_append_entries_resp(nuraft::resp_msg&)::
                                         extra_order_timer), iVar5 != 0)) {
          timer_helper::timer_helper
                    (in_stack_fffffffffffffad0,
                     CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                     SUB81((ulong)in_stack_fffffffffffffac0 >> 0x38,0));
          __cxa_guard_release(&handle_append_entries_resp(nuraft::resp_msg&)::extra_order_timer);
        }
        bVar3 = timer_helper::timeout_and_reset(in_stack_fffffffffffffb08);
        local_1bc = 6;
        if (bVar3) {
          local_1bc = 4;
        }
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
        if (bVar3) {
          peVar19 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bc873);
          iVar5 = (*peVar19->_vptr_logger[7])();
          if ((int)local_1bc <= iVar5) {
            in_stack_fffffffffffffbd0 =
                 std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bc8b0);
            in_stack_fffffffffffffbdc = local_1bc;
            peVar13 = std::
                      __shared_ptr_access<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1bc8d3);
            pcVar14 = resp_appendix::extra_order_msg(peVar13->extra_order_);
            msg_if_given_abi_cxx11_((char *)local_1e0,"received extra order: %s",pcVar14);
            (*in_stack_fffffffffffffbd0->_vptr_logger[8])
                      (in_stack_fffffffffffffbd0,(ulong)in_stack_fffffffffffffbdc,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"handle_append_entries_resp",0x407,local_1e0);
            std::__cxx11::string::~string(local_1e0);
          }
        }
        std::shared_ptr<nuraft::resp_appendix>::~shared_ptr
                  ((shared_ptr<nuraft::resp_appendix> *)0x1bc9b2);
      }
      if (((local_181 & 1) != 0) && (local_180 != 0)) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1bc9e8);
        peer::set_next_log_idx(in_stack_fffffffffffffac0,(ulong)in_stack_fffffffffffffab8);
      }
    }
    else {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1bc6a5);
      resp_msg::get_next_idx(local_40);
      peer::set_next_log_idx(in_stack_fffffffffffffac0,(ulong)in_stack_fffffffffffffab8);
    }
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bca0e);
    local_1e1 = peer::need_to_suppress_error(in_stack_fffffffffffffac0);
    if ((handle_append_entries_resp(nuraft::resp_msg&)::log_timer == '\0') &&
       (iVar5 = __cxa_guard_acquire(&handle_append_entries_resp(nuraft::resp_msg&)::log_timer),
       iVar5 != 0)) {
      timer_helper::timer_helper
                (in_stack_fffffffffffffad0,
                 CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 SUB81((ulong)in_stack_fffffffffffffac0 >> 0x38,0));
      __cxa_guard_release(&handle_append_entries_resp(nuraft::resp_msg&)::log_timer);
    }
    local_1e8 = 3;
    if ((local_1e1 & 1) != 0) {
      local_1e8 = 4;
    }
    if ((local_1e8 == 3) &&
       (bVar3 = timer_helper::timeout_and_reset(in_stack_fffffffffffffb08), !bVar3)) {
      local_1e8 = 6;
    }
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
    if (bVar3) {
      peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bcb1c);
      iVar5 = (*peVar19->_vptr_logger[7])();
      if ((int)local_1e8 <= iVar5) {
        peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bcb59);
        uVar10 = local_1e8;
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1bcb7c);
        uVar6 = peer::get_id((peer *)0x1bcb84);
        uVar2 = local_180;
        uVar12 = resp_msg::get_next_idx(local_40);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1bcbc1);
        uVar15 = peer::get_next_log_idx((peer *)0x1bcbc9);
        msg_if_given_abi_cxx11_
                  ((char *)local_208,
                   "declined append: peer %d, prev next log idx %lu, resp next %lu, new next log idx %lu"
                   ,(ulong)uVar6,uVar2,uVar12,uVar15);
        (*peVar19->_vptr_logger[8])
                  (peVar19,(ulong)uVar10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"handle_append_entries_resp",0x41d,local_208);
        std::__cxx11::string::~string(local_208);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1bcc7f);
  }
  peVar11 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1bcca0);
  local_210 = (raft_server *)peer::get_matched_idx(peVar11);
  bVar3 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
  if (bVar3) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bccec);
    iVar7 = peer::get_id((peer *)0x1bccf4);
    _Var8 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
    prVar1 = local_210;
    if ((iVar7 == _Var8) && (local_210 != (raft_server *)0x0)) {
      peVar16 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bcd55);
      iVar5 = (*peVar16->_vptr_log_store[2])();
      if (prVar1 == (raft_server *)(CONCAT44(extraout_var_00,iVar5) - 1U)) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1bcd95);
        bVar3 = peer::make_busy(in_stack_fffffffffffffac0);
        if (bVar3) {
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
          __i = (undefined1)((ulong)in_stack_fffffffffffffab8 >> 0x38);
          if (bVar3) {
            peVar19 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1bcde7);
            iVar5 = (*peVar19->_vptr_logger[7])();
            if (3 < iVar5) {
              peVar19 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x1bce20);
              paVar17 = &in_RDI->next_leader_candidate_;
              local_c = 5;
              local_8 = paVar17;
              local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
              if (local_c - 1U < 2) {
                local_14 = (paVar17->super___atomic_base<int>)._M_i;
              }
              else if (local_c == 5) {
                local_14 = (paVar17->super___atomic_base<int>)._M_i;
              }
              else {
                local_14 = (paVar17->super___atomic_base<int>)._M_i;
              }
              uVar10 = local_14;
              in_stack_fffffffffffffb50 = local_210;
              in_stack_fffffffffffffb74 = local_c;
              uVar18 = timer_helper::get_us((timer_helper *)in_stack_fffffffffffffb00);
              msg_if_given_abi_cxx11_
                        ((char *)local_230,
                         "ready to resign, server id %d, latest log index %lu, %lu us elapsed, resign now"
                         ,(ulong)uVar10,in_stack_fffffffffffffb50,uVar18);
              (*peVar19->_vptr_logger[8])
                        (peVar19,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                         ,"handle_append_entries_resp",0x433,local_230);
              std::__cxx11::string::~string(local_230);
            }
          }
          std::__atomic_base<int>::operator=
                    ((__atomic_base<int> *)
                     CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                     (__int_type_conflict)((ulong)in_stack_fffffffffffffac0 >> 0x20));
          std::function<int()>::operator=
                    ((function<int_()> *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     in_stack_fffffffffffffad8);
          become_follower(in_stack_fffffffffffffb50);
          update_rand_timeout((raft_server *)
                              CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffac0,(bool)__i);
          std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1bd026);
          local_250 = srv_state::get_term((srv_state *)0x1bd02e);
          local_254 = 0x1c;
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1bd071);
          local_258 = peer::get_id((peer *)0x1bd079);
          peVar16 = std::
                    __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1bd0a4);
          iVar5 = (*peVar16->_vptr_log_store[2])();
          this_00 = (custom_notification_msg *)CONCAT44(extraout_var_01,iVar5);
          local_260 = term_for_log((raft_server *)
                                   CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                                   (ulong)in_stack_fffffffffffffbd0);
          peVar16 = std::
                    __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1bd0f4);
          iVar5 = (*peVar16->_vptr_log_store[2])();
          local_270._8_8_ = CONCAT44(extraout_var_02,iVar5) + -1;
          args_6 = &in_RDI->quick_commit_index_;
          local_24 = 5;
          local_20 = args_6;
          local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_24 - 1U < 2) {
            local_30 = (element_type *)(args_6->super___atomic_base<unsigned_long>)._M_i;
          }
          else if (local_24 == 5) {
            local_30 = (element_type *)(args_6->super___atomic_base<unsigned_long>)._M_i;
          }
          else {
            local_30 = (element_type *)(args_6->super___atomic_base<unsigned_long>)._M_i;
          }
          local_270._0_8_ = local_30;
          args_1 = (shared_ptr<nuraft::buffer> *)local_270;
          args = (shared_ptr<nuraft::peer> *)(local_270 + 8);
          cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
                    (in_stack_fffffffffffffae8,
                     (msg_type *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     (int *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0,
                     (unsigned_long *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                     (unsigned_long *)in_stack_fffffffffffffb00,(unsigned_long *)args_6);
          local_284 = 2;
          cs_new<nuraft::custom_notification_msg,nuraft::custom_notification_msg::type>
                    ((type *)args);
          local_29c = 0;
          std::
          __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1bd248);
          custom_notification_msg::serialize(this_00);
          local_2b1 = 0xe7;
          cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                    ((int *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),args_1,
                     (log_val_type *)args);
          std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1bd296);
          this_01 = std::
                    __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bd2a3);
          req_msg::log_entries(this_01);
          std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       *)in_stack_fffffffffffffad0,
                      (value_type *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1bd2d8);
          std::shared_ptr<nuraft::peer>::shared_ptr((shared_ptr<nuraft::peer> *)args_1,args);
          peer::send_req(in_stack_fffffffffffffc80,(ptr<peer> *)in_stack_fffffffffffffc78,
                         in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1bd329);
          local_2cc = 1;
          std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1bd341)
          ;
          std::shared_ptr<nuraft::custom_notification_msg>::~shared_ptr
                    ((shared_ptr<nuraft::custom_notification_msg> *)0x1bd34e);
          std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1bd35b);
          goto LAB_001bd5fb;
        }
      }
    }
  }
  if (local_f0 < 0) {
    local_b1 = false;
  }
  sVar9 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1bd43c);
  if (sVar9 == leader) {
    if ((local_b1 & 1U) != 0) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar3) {
        peVar19 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bd484);
        iVar5 = (*peVar19->_vptr_logger[7])();
        if (4 < iVar5) {
          peVar19 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1bd4b7);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1bd4c9);
          uVar10 = peer::get_id((peer *)0x1bd4d1);
          msg_if_given_abi_cxx11_
                    ((char *)local_2f0,"reqeust append entries need to catchup, p %d\n",
                     (ulong)uVar10);
          (*peVar19->_vptr_logger[8])
                    (peVar19,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"handle_append_entries_resp",0x467,local_2f0);
          std::__cxx11::string::~string(local_2f0);
        }
      }
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffac0,
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffab8);
      request_append_entries(in_stack_00000088,in_stack_00000080);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1bd594);
    }
    bVar3 = timer_helper::timeout_and_reset(in_stack_fffffffffffffb08);
    if (bVar3) {
      check_overall_status((raft_server *)0x1bd5ea);
    }
  }
  local_2cc = 0;
LAB_001bd5fb:
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1bd608);
  return;
}

Assistant:

void raft_server::handle_append_entries_resp(resp_msg& resp) {
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }

    check_srv_to_leave_timeout();
    if ( srv_to_leave_ &&
         srv_to_leave_->get_id() == resp.get_src() &&
         srv_to_leave_->is_stepping_down() &&
         resp.get_next_idx() > srv_to_leave_target_idx_ ) {
        // Catch-up is done.
        p_in("server to be removed %d fully caught up the "
             "target config log %" PRIu64,
             srv_to_leave_->get_id(),
             srv_to_leave_target_idx_);
        remove_peer_from_peers(srv_to_leave_);
        reset_srv_to_leave();
        return;
    }

    // If there are pending logs to be synced or commit index need to be advanced,
    // continue to send appendEntries to this peer
    bool need_to_catchup = true;

    ptr<peer> p = it->second;
    p_tr("handle append entries resp (from %d), resp.get_next_idx(): %" PRIu64,
         (int)p->get_id(), resp.get_next_idx());

    int64 bs_hint = resp.get_next_batch_size_hint_in_bytes();
    p_tr("peer %d batch size hint: %" PRId64 " bytes", p->get_id(), bs_hint);
    p->set_next_batch_size_hint_in_bytes(bs_hint);

    if (resp.get_accepted()) {
        uint64_t prev_matched_idx = 0;
        uint64_t new_matched_idx = 0;
        {
            std::lock_guard<std::mutex> l(p->get_lock());
            p->set_next_log_idx(resp.get_next_idx());
            prev_matched_idx = p->get_matched_idx();
            new_matched_idx = resp.get_next_idx() - 1;
            p_tr("peer %d, prev matched idx: %" PRIu64 ", new matched idx: %" PRIu64,
                 p->get_id(), prev_matched_idx, new_matched_idx);
            p->set_matched_idx(new_matched_idx);
            p->set_last_accepted_log_idx(new_matched_idx);
        }
        cb_func::Param param(id_, leader_, p->get_id());
        param.ctx = &new_matched_idx;
        CbReturnCode rc = ctx_->cb_func_.call
                          ( cb_func::GotAppendEntryRespFromPeer, &param );
        (void)rc;

        // Try to commit with this response.
        ulong committed_index = get_expected_committed_log_idx();
        commit( committed_index );
        need_to_catchup = p->clear_pending_commit() ||
                          resp.get_next_idx() < log_store_->next_slot();

    } else {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ulong prev_next_log = p->get_next_log_idx();
        if (resp.get_next_idx() > 0 && prev_next_log > resp.get_next_idx()) {
            // fast move for the peer to catch up
            p->set_next_log_idx(resp.get_next_idx());
        } else {
            bool do_log_rewind = true;
            // If not, check an extra order exists.
            if (resp.get_ctx()) {
                ptr<resp_appendix> appendix = resp_appendix::deserialize(*resp.get_ctx());
                if (appendix->extra_order_ == resp_appendix::DO_NOT_REWIND) {
                    do_log_rewind = false;
                }

                static timer_helper extra_order_timer(1000 * 1000, true);
                int log_lv = extra_order_timer.timeout_and_reset() ? L_INFO : L_TRACE;
                p_lv(log_lv, "received extra order: %s",
                     resp_appendix::extra_order_msg(appendix->extra_order_));
            }
            // if not, move one log backward.
            // WARNING: Make sure that `next_log_idx_` shouldn't be smaller than 0.
            if (do_log_rewind && prev_next_log) {
                p->set_next_log_idx(prev_next_log - 1);
            }
        }
        bool suppress = p->need_to_suppress_error();

        // To avoid verbose logs here.
        static timer_helper log_timer(500 * 1000, true);
        int log_lv = suppress ? L_INFO : L_WARN;
        if (log_lv == L_WARN) {
            if (!log_timer.timeout_and_reset()) {
                log_lv = L_TRACE;
            }
        }
        p_lv( log_lv,
              "declined append: peer %d, prev next log idx %" PRIu64 ", "
              "resp next %" PRIu64 ", new next log idx %" PRIu64,
              p->get_id(), prev_next_log,
              resp.get_next_idx(), p->get_next_log_idx() );
    }

    // NOTE:
    //   If all other followers are not responding, we may not make
    //   below condition true. In that case, we check the timeout of
    //   re-election timer in heartbeat handler, and do force resign.
    ulong p_matched_idx = p->get_matched_idx();
    if ( write_paused_ &&
         p->get_id() == next_leader_candidate_ &&
         p_matched_idx &&
         p_matched_idx == log_store_->next_slot() - 1 &&
         p->make_busy() ) {
        // NOTE:
        //   If `make_busy` fails (very unlikely to happen), next
        //   response handler (of heartbeat, append_entries ..) will
        //   retry this.
        p_in("ready to resign, server id %d, "
             "latest log index %" PRIu64 ", "
             "%" PRIu64 " us elapsed, resign now",
             next_leader_candidate_.load(),
             p_matched_idx,
             reelection_timer_.get_us());
        leader_ = -1;

        // To avoid this node becomes next leader again, set timeout
        // value bigger than any others, just once at this time.
        rand_timeout_ = [this]() -> int32 {
            return this->ctx_->get_params()->election_timeout_upper_bound_ +
                   this->ctx_->get_params()->election_timeout_lower_bound_;
        };
        become_follower();
        update_rand_timeout();

        // Clear live flag to avoid pre-vote rejection.
        hb_alive_ = false;

        // Send leadership takeover request to this follower.
        ptr<req_msg> req = cs_new<req_msg>
                           ( state_->get_term(),
                             msg_type::custom_notification_request,
                             id_, p->get_id(),
                             term_for_log(log_store_->next_slot() - 1),
                             log_store_->next_slot() - 1,
                             quick_commit_index_.load() );

        // Create a notification.
        ptr<custom_notification_msg> custom_noti =
            cs_new<custom_notification_msg>
            ( custom_notification_msg::leadership_takeover );

        // Wrap it using log_entry.
        ptr<log_entry> custom_noti_le =
            cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

        req->log_entries().push_back(custom_noti_le);
        p->send_req(p, req, resp_handler_);
        return;
    }

    if (bs_hint < 0) {
        // If hint is a negative number, we should set `need_to_catchup`
        // to `false` to avoid sending meaningless messages continuously
        // which eats up CPU. Then the leader will send heartbeats only.
        need_to_catchup = false;
    }

    // This may not be a leader anymore,
    // such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader) {
        if (need_to_catchup) {
            p_db("reqeust append entries need to catchup, p %d\n",
                 (int)p->get_id());
            request_append_entries(p);
        }
        if (status_check_timer_.timeout_and_reset()) {
            check_overall_status();
        }
    }
}